

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

int onig_is_in_code_range(OnigUChar *p,OnigCodePoint code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  uVar2 = *(uint *)p;
  while (uVar1 = uVar2, uVar3 < uVar1) {
    uVar2 = uVar1 + uVar3 >> 1;
    if (*(uint *)(p + (ulong)(uVar1 + uVar3 | 1) * 4 + 4) < code) {
      uVar3 = uVar2 + 1;
      uVar2 = uVar1;
    }
  }
  uVar2 = 0;
  if (uVar3 < *(uint *)p) {
    uVar2 = (uint)(*(uint *)(p + (ulong)(uVar3 * 2) * 4 + 4) <= code);
  }
  return uVar2;
}

Assistant:

extern int
onig_is_in_code_range(const UChar* p, OnigCodePoint code)
{
  OnigCodePoint n, *data;
  OnigCodePoint low, high, x;

  GET_CODE_POINT(n, p);
  data = (OnigCodePoint* )p;
  data++;

  for (low = 0, high = n; low < high; ) {
    x = (low + high) >> 1;
    if (code > data[x * 2 + 1])
      low = x + 1;
    else
      high = x;
  }

  return ((low < n && code >= data[low * 2]) ? 1 : 0);
}